

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall booster::log::logger::reset_log_level(logger *this,char *module)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&((this->d).ptr_)->entries_lock);
  uVar2 = this->entries_size_;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  lVar4 = 0;
  do {
    lVar6 = lVar4;
    if (uVar7 * 0x10 + 0x10 == lVar6 + 0x10) goto LAB_0017b15c;
    iVar5 = strcmp(*(char **)((long)&this->entries_[0].module + lVar6),module);
    lVar4 = lVar6 + 0x10;
  } while (iVar5 != 0);
  uVar3 = *(undefined8 *)&this->entries_[(long)(int)uVar2 + -1].level;
  puVar1 = (undefined8 *)((long)&this->entries_[0].module + lVar6);
  *puVar1 = this->entries_[(long)(int)uVar2 + -1].module;
  puVar1[1] = uVar3;
  iVar5 = this->entries_size_;
  this->entries_size_ = iVar5 + -1;
  this->entries_[(long)iVar5 + -1].module = (char *)0x0;
LAB_0017b15c:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void logger::reset_log_level(char const *module)
	{
		unique_lock<mutex> l(d->entries_lock);
		for(int i=0;i<entries_size_;i++) {
			if(strcmp(entries_[i].module,module)==0) {
				entries_[i]=entries_[entries_size_-1];
				entries_size_--;
				entries_[entries_size_].module = 0;
				return;
			}
		}
	}